

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void testInvalidPacketAreDetected(void)

{
  Status SVar1;
  undefined1 *puVar2;
  ostream *poVar3;
  string *in_stack_00000058;
  bool condition_1;
  PacketT<packet::DefaultConfig> pkt_1;
  string serialized_test_1;
  bool condition;
  PacketT<packet::DefaultConfig> pkt;
  string serialized_test;
  string serialized;
  string pkt_msg;
  string *in_stack_fffffffffffffe48;
  PacketT<packet::DefaultConfig> local_140;
  string local_f0 [39];
  undefined1 local_c9;
  PacketT<packet::DefaultConfig> local_c8;
  string local_78 [32];
  string local_58 [55];
  allocator local_21;
  string local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"this is a example of message",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  serializePacketFromData<packet::PacketT<packet::DefaultConfig>>(in_stack_00000058);
  std::__cxx11::string::string(local_78,local_58);
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_78);
  *puVar2 = 0x3d;
  readPacket<packet::PacketT<packet::DefaultConfig>>(in_stack_fffffffffffffe48);
  SVar1 = packet::PacketT<packet::DefaultConfig>::status(&local_c8);
  local_c9 = SVar1 == INVALID;
  if (!(bool)local_c9) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"testInvalidPacketAreDetected");
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x7e);
    std::operator<<(poVar3,"] TEST_ASSERT failed pkt.status() == packet::Status::INVALID\n");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                  ,0x7e,"void testInvalidPacketAreDetected()");
  }
  packet::PacketT<packet::DefaultConfig>::~PacketT((PacketT<packet::DefaultConfig> *)0x1094bb);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::string(local_f0,local_58);
  std::__cxx11::string::size();
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_f0);
  *puVar2 = 0x3f;
  readPacket<packet::PacketT<packet::DefaultConfig>>(in_stack_fffffffffffffe48);
  SVar1 = packet::PacketT<packet::DefaultConfig>::status(&local_140);
  if (SVar1 != INVALID) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"testInvalidPacketAreDetected");
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x86);
    std::operator<<(poVar3,"] TEST_ASSERT failed pkt.status() == packet::Status::INVALID\n");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                  ,0x86,"void testInvalidPacketAreDetected()");
  }
  packet::PacketT<packet::DefaultConfig>::~PacketT((PacketT<packet::DefaultConfig> *)0x109682);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

void
testInvalidPacketAreDetected()
{
    const std::string pkt_msg = "this is a example of message";
    const std::string serialized = serializePacketFromData<packet::DefaultPacket>(pkt_msg);
    {
        // invalid head
        std::string serialized_test = serialized;
        serialized_test[0] = packet::DefaultStartPattern::value[0] + 1;
        auto pkt = readPacket<packet::DefaultPacket>(serialized_test);
        TEST_ASSERT(pkt.status() == packet::Status::INVALID);
    }

    {
        // invalid tail
        std::string serialized_test = serialized;
        serialized_test[serialized_test.size() - 1] = packet::DefaultEndPattern::value[0] + 1;
        auto pkt = readPacket<packet::DefaultPacket>(serialized_test);
        TEST_ASSERT(pkt.status() == packet::Status::INVALID);
    }
}